

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ladspa.c
# Opt level: O0

int ladspa_segment_get(uint32_t field,void *value,mixed_segment *segment)

{
  uint uVar1;
  long *plVar2;
  uint local_30;
  LADSPA_PortDescriptor port;
  uint32_t i;
  uint32_t index;
  ladspa_segment_data *data;
  mixed_segment *segment_local;
  void *value_local;
  uint32_t field_local;
  
  plVar2 = (long *)segment->data;
  port = 0;
  local_30 = 0;
  do {
    if (*(ulong *)(*plVar2 + 0x30) <= (ulong)local_30) {
      mixed_err(7);
      return 0;
    }
    uVar1 = *(uint *)(*(long *)(*plVar2 + 0x38) + (ulong)local_30 * 4);
    if (((uVar1 & 4) != 0) && ((uVar1 & 2) != 0)) {
      if (port == field) {
        *(undefined4 *)value = *(undefined4 *)(plVar2[3] + (ulong)local_30 * 0x10 + 0xc);
        return 1;
      }
      port = port + 1;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

int ladspa_segment_get(uint32_t field, void *value, struct mixed_segment *segment){
  // I don't think the LADSPA interface is compatible with how we want
  // to use it. If I read it correctly, it says that the output controls
  // are only updated while the plugin is actually run, which is not
  // what we want here in most cases.
  struct ladspa_segment_data *data = (struct ladspa_segment_data *)segment->data;
  uint32_t index = 0;
  for(uint32_t i=0; i<data->descriptor->PortCount; ++i){
    const LADSPA_PortDescriptor port = data->descriptor->PortDescriptors[i];
    if(LADSPA_IS_PORT_CONTROL(port) && LADSPA_IS_PORT_OUTPUT(port)){
      if(index == field){
        *((float *)value) = data->ports[i].control;
        return 1;
      }
      ++index;
    }
  }
  mixed_err(MIXED_INVALID_FIELD);
  return 0;
}